

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicProfileStorage.cpp
# Opt level: O0

bool DynamicProfileStorage::CreateCacheCatalog(void)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  byte local_49;
  int local_38 [4];
  undefined1 local_28 [8];
  DynamicProfileStorageReaderWriter catalogFile;
  
  if (!enabled) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/DynamicProfileStorage.cpp"
                       ,0x318,"(enabled)","enabled");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  if ((useCacheDir & 1U) == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/DynamicProfileStorage.cpp"
                       ,0x319,"(useCacheDir)","useCacheDir");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  if ((locked & 1U) == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/DynamicProfileStorage.cpp"
                       ,0x31a,"(locked)","locked");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  nextFileId = 0;
  creationTime = GetCreationTime();
  DynamicProfileStorageReaderWriter::DynamicProfileStorageReaderWriter
            ((DynamicProfileStorageReaderWriter *)local_28);
  bVar2 = DynamicProfileStorageReaderWriter::Init
                    ((DynamicProfileStorageReaderWriter *)local_28,catalogFilename,L"wb",true,
                     (errno_t *)0x0);
  local_49 = 1;
  if (bVar2) {
    bVar2 = DynamicProfileStorageReaderWriter::Write<unsigned_int>
                      ((DynamicProfileStorageReaderWriter *)local_28,&MagicNumber);
    local_49 = 1;
    if (bVar2) {
      bVar2 = DynamicProfileStorageReaderWriter::Write<unsigned_int>
                        ((DynamicProfileStorageReaderWriter *)local_28,&FileFormatVersion);
      local_49 = 1;
      if (bVar2) {
        bVar2 = DynamicProfileStorageReaderWriter::Write<long>
                          ((DynamicProfileStorageReaderWriter *)local_28,&creationTime);
        local_49 = 1;
        if (bVar2) {
          local_38[0] = 0;
          bVar2 = DynamicProfileStorageReaderWriter::Write<int>
                            ((DynamicProfileStorageReaderWriter *)local_28,local_38);
          local_49 = bVar2 ^ 0xff;
        }
      }
    }
  }
  if ((local_49 & 1) == 0) {
    lastOffset = DynamicProfileStorageReaderWriter::Size
                           ((DynamicProfileStorageReaderWriter *)local_28);
    ClearInfoMap(true);
    DynamicProfileStorageReaderWriter::Close((DynamicProfileStorageReaderWriter *)local_28,false);
    bVar2 = DoTrace();
    if (bVar2) {
      Output::Print(L"TRACE: DynamicProfileStorage: Cache directory catalog created: \'%s\'\n",
                    catalogFilename);
      Output::Flush();
    }
    catalogFile._23_1_ = 1;
  }
  else {
    DisableCacheDir();
    Output::Print(L"ERROR: DynamicProfileStorage: Unable to create cache catalog\n");
    Output::Flush();
    catalogFile._23_1_ = 0;
  }
  DynamicProfileStorageReaderWriter::~DynamicProfileStorageReaderWriter
            ((DynamicProfileStorageReaderWriter *)local_28);
  return (bool)(catalogFile._23_1_ & 1);
}

Assistant:

bool DynamicProfileStorage::CreateCacheCatalog()
{
    AssertOrFailFast(enabled);
    AssertOrFailFast(useCacheDir);
    AssertOrFailFast(locked);
    nextFileId = 0;
    creationTime = GetCreationTime();
    DynamicProfileStorageReaderWriter catalogFile;
    if (!catalogFile.Init(catalogFilename, _u("wb"), true)
        || !catalogFile.Write(MagicNumber)
        || !catalogFile.Write(FileFormatVersion)
        || !catalogFile.Write(creationTime)
        || !catalogFile.Write(0)) // count
    {
        DisableCacheDir();
        Output::Print(_u("ERROR: DynamicProfileStorage: Unable to create cache catalog\n"));
        Output::Flush();
        return false;
    }
    lastOffset = catalogFile.Size();
    ClearInfoMap(true);
    catalogFile.Close();

#if DBG_DUMP
    if (DynamicProfileStorage::DoTrace())
    {
        Output::Print(_u("TRACE: DynamicProfileStorage: Cache directory catalog created: '%s'\n"), catalogFilename);
        Output::Flush();
    }
#endif
    return true;
}